

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.h
# Opt level: O0

void set_planes_to_loop_filter(loopfilter *lf,int *planes_to_lf,int plane_start,int plane_end)

{
  bool local_1b;
  bool local_1a;
  bool local_19;
  int plane_end_local;
  int plane_start_local;
  int *planes_to_lf_local;
  loopfilter *lf_local;
  
  if (((lf->filter_level[0] != 0) || (local_19 = false, lf->filter_level[1] != 0)) &&
     (local_19 = false, plane_start < 1)) {
    local_19 = 0 < plane_end;
  }
  *planes_to_lf = (uint)local_19;
  local_1a = false;
  if ((lf->filter_level_u != 0) && (local_1a = false, plane_start < 2)) {
    local_1a = 1 < plane_end;
  }
  planes_to_lf[1] = (uint)local_1a;
  local_1b = false;
  if ((lf->filter_level_v != 0) && (local_1b = false, plane_start < 3)) {
    local_1b = 2 < plane_end;
  }
  planes_to_lf[2] = (uint)local_1b;
  return;
}

Assistant:

static inline void set_planes_to_loop_filter(const struct loopfilter *lf,
                                             int planes_to_lf[MAX_MB_PLANE],
                                             int plane_start, int plane_end) {
  // For each luma and chroma plane, whether to filter it or not.
  planes_to_lf[0] = (lf->filter_level[0] || lf->filter_level[1]) &&
                    plane_start <= 0 && 0 < plane_end;
  planes_to_lf[1] = lf->filter_level_u && plane_start <= 1 && 1 < plane_end;
  planes_to_lf[2] = lf->filter_level_v && plane_start <= 2 && 2 < plane_end;
}